

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

void __thiscall
license::EventRegistry::exportLastEvents
          (EventRegistry *this,AuditEvent_conflict *auditEvents,int nlogs)

{
  pointer_conflict paVar1;
  int iVar2;
  
  paVar1 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = (int)(((long)paVar1 -
                (long)(this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x508);
  if (iVar2 < nlogs) {
    nlogs = iVar2;
  }
  if (nlogs != 0) {
    memmove(auditEvents,paVar1 + -(long)nlogs,(long)nlogs * 0x508);
    return;
  }
  return;
}

Assistant:

void EventRegistry::exportLastEvents(AuditEvent *auditEvents, int nlogs) {
	const int sizeToCopy = min(nlogs, (int)logs.size());
	std::copy(logs.end() - sizeToCopy, logs.end(), auditEvents);
}